

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SemanticAnalyserTests.cpp
# Opt level: O3

void __thiscall
SemanticAnalyserTest_UndeclaredFunctionCallInArgumentThrows_Test::
~SemanticAnalyserTest_UndeclaredFunctionCallInArgumentThrows_Test
          (SemanticAnalyserTest_UndeclaredFunctionCallInArgumentThrows_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(SemanticAnalyserTest, UndeclaredFunctionCallInArgumentThrows)
{
  std::string source = R"SRC(
  fn f(): f32 { ret 5; }

  fn main(): f32
  {
    let x: f32 = 12;
    f(test(x));
    ret 0;
  }
  )SRC";
  throwTest(source);
}